

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

Hsh_VecMan_t * Hsh_VecManStart(int nEntries)

{
  uint uVar1;
  Hsh_VecMan_t *pHVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  pHVar2 = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar7 = 999;
  while( true ) {
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 + 1;
    } while ((uVar6 & 1) != 0);
    if (uVar7 < 9) break;
    iVar5 = 5;
    while (uVar7 % (iVar5 - 2U) != 0) {
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar7 < uVar1) goto LAB_00678d66;
    }
  }
LAB_00678d66:
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar6) {
    uVar1 = uVar7;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar1;
  piVar4 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar3->pArray = piVar4;
  pVVar3->nSize = uVar7;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0xff,(long)(int)uVar7 << 2);
  }
  pHVar2->vTable = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 4000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(16000);
  pVVar3->pArray = piVar4;
  pHVar2->vData = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pHVar2->vMap = pVVar3;
  return pHVar2;
}

Assistant:

static inline Hsh_VecMan_t * Hsh_VecManStart( int nEntries )
{
    Hsh_VecMan_t * p;
    p = ABC_CALLOC( Hsh_VecMan_t, 1 );
    p->vTable = Vec_IntStartFull( Abc_PrimeCudd(nEntries) );
    p->vData  = Vec_IntAlloc( nEntries * 4 );
    p->vMap   = Vec_IntAlloc( nEntries );
    return p;
}